

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_2::loadFlatScanLineImage(string *fileName,Header *hdr,FlatImage *img)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *psVar6;
  FlatImageChannel *pFVar7;
  Box2i *pBVar8;
  Attribute *pAVar9;
  _Base_ptr in_RDX;
  Image *in_RSI;
  ConstIterator i_2;
  ConstIterator i_1;
  FrameBuffer fb;
  FlatImageLevel *level;
  ConstIterator i;
  ChannelList *cl;
  InputFile in;
  FlatImageLevel *in_stack_fffffffffffffde8;
  Image *in_stack_fffffffffffffdf0;
  Image *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined1 local_108 [56];
  iterator local_d0;
  iterator local_c0;
  string local_b0 [48];
  ImageLevel *local_80;
  allocator<char> local_71;
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_30;
  _Base_ptr local_18;
  Image *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)&stack0xffffffffffffffd8,pcVar4,iVar3);
  Imf_3_2::InputFile::header();
  local_30 = Imf_3_2::Header::channels();
  Image::clearChannels(in_stack_fffffffffffffe00);
  local_48 = Imf_3_2::ChannelList::begin();
  while( true ) {
    local_50 = Imf_3_2::ChannelList::end();
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffdf0,
                       (ConstIterator *)in_stack_fffffffffffffde8);
    p_Var1 = local_18;
    if (!bVar2) break;
    ChannelList::ConstIterator::name((ConstIterator *)0x12deae);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ChannelList::ConstIterator::channel((ConstIterator *)0x12def9);
    Image::insertChannel
              (in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8,(Channel *)0x12df20);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffdf0);
  }
  Imf_3_2::InputFile::header();
  uVar5 = Imf_3_2::Header::dataWindow();
  (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,uVar5,0);
  local_80 = (ImageLevel *)(**(code **)(*(long *)local_18 + 0x18))(local_18,0);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x12e049);
  local_c0._M_node = (_Base_ptr)FlatImageLevel::begin(in_stack_fffffffffffffde8);
  FlatImageLevel::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffdf0,(Iterator *)in_stack_fffffffffffffde8);
  while( true ) {
    local_d0._M_node = (_Base_ptr)FlatImageLevel::end(in_stack_fffffffffffffde8);
    FlatImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffdf0,(Iterator *)in_stack_fffffffffffffde8);
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffdf0,
                       (ConstIterator *)in_stack_fffffffffffffde8);
    if (!bVar2) break;
    psVar6 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12e0f6);
    pFVar7 = FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12e10a);
    (*(pFVar7->super_ImageChannel)._vptr_ImageChannel[4])(local_108);
    Imf_3_2::FrameBuffer::insert(local_b0,(Slice *)psVar6);
    FlatImageLevel::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffdf0);
  }
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&stack0xffffffffffffffd8);
  pBVar8 = ImageLevel::dataWindow(local_80);
  iVar3 = (pBVar8->min).y;
  ImageLevel::dataWindow(local_80);
  Imf_3_2::InputFile::readPixels((int)&stack0xffffffffffffffd8,iVar3);
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::begin();
  while( true ) {
    Imf_3_2::InputFile::header();
    Imf_3_2::Header::end();
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffdf0,
                       (ConstIterator *)in_stack_fffffffffffffde8);
    if (!bVar2) break;
    pcVar4 = Header::ConstIterator::name((ConstIterator *)0x12e280);
    iVar3 = strcmp(pcVar4,"tiles");
    if (iVar3 != 0) {
      in_stack_fffffffffffffdf0 = local_10;
      pAVar9 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x12e2b7);
      in_stack_fffffffffffffde8 =
           (FlatImageLevel *)Header::ConstIterator::attribute((ConstIterator *)0x12e2cb);
      Imf_3_2::Header::insert((char *)in_stack_fffffffffffffdf0,pAVar9);
    }
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffdf0);
  }
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x12e30b);
  Imf_3_2::InputFile::~InputFile((InputFile *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
loadFlatScanLineImage (const string& fileName, Header& hdr, FlatImage& img)
{
    InputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (in.header ().dataWindow (), ONE_LEVEL, ROUND_DOWN);

    FlatImageLevel& level = img.level ();
    FrameBuffer     fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);
    in.readPixels (level.dataWindow ().min.y, level.dataWindow ().max.y);

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        if (strcmp (i.name (), "tiles")) hdr.insert (i.name (), i.attribute ());
    }
}